

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# js_generator.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::js::Generator::GenerateClassConstructor
          (Generator *this,GeneratorOptions *options,Printer *printer,Descriptor *desc)

{
  Printer *this_00;
  bool bVar1;
  int iVar2;
  int iVar3;
  undefined8 *puVar4;
  string *__return_storage_ptr__;
  string *descriptor;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar5;
  long lVar6;
  int iVar7;
  Descriptor *this_01;
  long lVar8;
  string local_f8;
  string local_d8;
  undefined1 local_b8 [32];
  Printer *local_98;
  string message_id;
  string local_70;
  string local_50;
  
  descriptor = &local_f8;
  __return_storage_ptr__ = &local_d8;
  (anonymous_namespace)::GetMessagePath_abi_cxx11_
            (__return_storage_ptr__,(_anonymous_namespace_ *)options,(GeneratorOptions *)desc,desc);
  io::Printer::Print(printer,
                     "/**\n * Generated by JsPbCodeGenerator.\n * @param {Array=} opt_data Optional initial data array, typically from a\n * server response, or constructed directly in Javascript. The array is used\n * in place and becomes part of the constructed object. It is not cloned.\n * If no data is provided, the constructed object will be empty, but still\n * valid.\n * @extends {jspb.Message}\n * @constructor\n */\n$classname$ = function(opt_data) {\n"
                     ,"classname",__return_storage_ptr__);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  message_id._M_dataplus._M_p = (pointer)&message_id.field_2;
  message_id._M_string_length = 0;
  message_id.field_2._M_local_buf[0] = '\0';
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"0","");
  iVar2 = (int)extraout_RDX;
  local_98 = printer;
  if (*(int *)(desc + 0x2c) < 1) {
    iVar7 = 0;
  }
  else {
    lVar8 = 0;
    lVar6 = 0;
    iVar7 = 0;
    uVar5 = extraout_RDX;
    do {
      if (((*(char *)(*(long *)(desc + 0x30) + 0x50 + lVar8) != '\x01') ||
          (iVar2 = std::__cxx11::string::compare
                             ((char *)**(undefined8 **)
                                        (*(long *)(*(long *)(desc + 0x30) + 0x58 + lVar8) + 0x10)),
          uVar5 = extraout_RDX_00, iVar2 != 0)) &&
         (iVar2 = *(int *)(*(long *)(desc + 0x30) + 0x38 + lVar8), iVar7 < iVar2)) {
        iVar7 = iVar2;
      }
      iVar2 = (int)uVar5;
      lVar6 = lVar6 + 1;
      lVar8 = lVar8 + 0xa8;
    } while (lVar6 < *(int *)(desc + 0x2c));
  }
  iVar3 = 0x1fffffff;
  if (iVar7 < 0x1fffffff) {
    iVar3 = iVar7;
  }
  this_01 = (Descriptor *)0xffffffff;
  if (0 < *(int *)(desc + 0x68)) {
    this_01 = (Descriptor *)(ulong)(iVar3 + 1);
  }
  SimpleItoa_abi_cxx11_(&local_70,(protobuf *)this_01,iVar2);
  bVar1 = anon_unknown_0::HasRepeatedFields((GeneratorOptions *)desc,this_01);
  if (bVar1) {
    (anonymous_namespace)::GetMessagePath_abi_cxx11_
              (&local_d8,(_anonymous_namespace_ *)options,(GeneratorOptions *)desc,
               (Descriptor *)__return_storage_ptr__);
    puVar4 = (undefined8 *)std::__cxx11::string::append((char *)&local_d8);
    local_b8._0_8_ = local_b8 + 0x10;
    __return_storage_ptr__ = (string *)(puVar4 + 2);
    if ((string *)*puVar4 == __return_storage_ptr__) {
      local_b8._16_8_ = (__return_storage_ptr__->_M_dataplus)._M_p;
      local_b8._24_8_ = puVar4[3];
    }
    else {
      local_b8._16_8_ = (__return_storage_ptr__->_M_dataplus)._M_p;
      local_b8._0_8_ = (string *)*puVar4;
    }
    local_b8._8_8_ = puVar4[1];
    *puVar4 = __return_storage_ptr__;
    puVar4[1] = 0;
    *(undefined1 *)(puVar4 + 2) = 0;
  }
  else {
    local_b8._0_8_ = local_b8 + 0x10;
    local_b8._8_8_ = 4;
    local_b8._16_5_ = 0x6c6c756e;
  }
  this_00 = local_98;
  if ((bVar1) &&
     ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2)) {
    operator_delete(local_d8._M_dataplus._M_p,local_d8.field_2._M_allocated_capacity + 1);
  }
  (anonymous_namespace)::OneofFieldsArrayName_abi_cxx11_
            (&local_50,(_anonymous_namespace_ *)options,(GeneratorOptions *)desc,
             (Descriptor *)__return_storage_ptr__);
  io::Printer::Print(this_00,
                     "  jspb.Message.initialize(this, opt_data, $messageId$, $pivot$, $rptfields$, $oneoffields$);\n"
                     ,"messageId",&local_f8,"pivot",&local_70,"rptfields",(string *)local_b8,
                     "oneoffields",&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  if ((string *)local_b8._0_8_ != (string *)(local_b8 + 0x10)) {
    operator_delete((void *)local_b8._0_8_,(ulong)(local_b8._16_8_ + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  (anonymous_namespace)::GetMessagePath_abi_cxx11_
            (&local_f8,(_anonymous_namespace_ *)options,(GeneratorOptions *)desc,
             (Descriptor *)descriptor);
  io::Printer::Print(this_00,
                     "};\ngoog.inherits($classname$, jspb.Message);\nif (goog.DEBUG && !COMPILED) {\n  $classname$.displayName = \'$classname$\';\n}\n"
                     ,"classname",&local_f8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p,local_f8.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)message_id._M_dataplus._M_p != &message_id.field_2) {
    operator_delete(message_id._M_dataplus._M_p,
                    CONCAT71(message_id.field_2._M_allocated_capacity._1_7_,
                             message_id.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void Generator::GenerateClassConstructor(const GeneratorOptions& options,
                                         io::Printer* printer,
                                         const Descriptor* desc) const {
  printer->Print(
      "/**\n"
      " * Generated by JsPbCodeGenerator.\n"
      " * @param {Array=} opt_data Optional initial data array, typically "
      "from a\n"
      " * server response, or constructed directly in Javascript. The array "
      "is used\n"
      " * in place and becomes part of the constructed object. It is not "
      "cloned.\n"
      " * If no data is provided, the constructed object will be empty, but "
      "still\n"
      " * valid.\n"
      " * @extends {jspb.Message}\n"
      " * @constructor\n"
      " */\n"
      "$classname$ = function(opt_data) {\n",
      "classname", GetMessagePath(options, desc));
  string message_id = GetMessageId(desc);
  printer->Print(
      "  jspb.Message.initialize(this, opt_data, $messageId$, $pivot$, "
      "$rptfields$, $oneoffields$);\n",
      "messageId", !message_id.empty() ?
                   ("'" + message_id + "'") :
                   (IsResponse(desc) ? "''" : "0"),
      "pivot", GetPivot(desc),
      "rptfields", RepeatedFieldsArrayName(options, desc),
      "oneoffields", OneofFieldsArrayName(options, desc));
  printer->Print(
      "};\n"
      "goog.inherits($classname$, jspb.Message);\n"
      "if (goog.DEBUG && !COMPILED) {\n"
      "  $classname$.displayName = '$classname$';\n"
      "}\n",
      "classname", GetMessagePath(options, desc));
}